

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O0

bool __thiscall Liby::http::ReplyParser::ParseStatus(ReplyParser *this,char *begin,char *end)

{
  bool bVar1;
  int iVar2;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_78;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_70;
  iterator it;
  allocator<char> local_51;
  string local_50;
  int local_2c;
  char *pcStack_28;
  int status;
  char *end_local;
  char *begin_local;
  ReplyParser *this_local;
  
  pcStack_28 = end;
  end_local = begin;
  begin_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)&local_50,begin,end,&local_51);
  iVar2 = std::__cxx11::stoi(&local_50,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_2c = iVar2;
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&status_number_abi_cxx11_,&local_2c);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&status_number_abi_cxx11_);
  bVar1 = std::__detail::operator==(&local_70,&local_78);
  if (!bVar1) {
    this->progress_ = 3;
    (this->super_Reply).status_ = local_2c;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool ReplyParser::ParseStatus(const char *begin, const char *end) {
    int status = std::stoi(std::string(begin, end));
    auto it = status_number.find(status);
    if (it == status_number.end()) {
        return false;
    } else {
        progress_ = ParsingStatusString;
        status_ = status;
        return true;
    }
}